

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

encoded_chars<char> tcb::unicode::detail::utf_traits<char,_1>::encode(code_point value)

{
  byte _1;
  encoded_chars<char> eStack_10;
  code_point value_local;
  
  _1 = (byte)value;
  if ((uint)value < 0x80) {
    encoded_chars<char>::encoded_chars(&stack0xfffffffffffffff0,_1);
  }
  else if ((uint)value < 0x800) {
    encoded_chars<char>::encoded_chars
              (&stack0xfffffffffffffff0,(byte)((uint)value >> 6) | 0xc0,_1 & 0x3f | 0x80);
  }
  else if ((uint)value < 0x10000) {
    encoded_chars<char>::encoded_chars
              (&stack0xfffffffffffffff0,(byte)((uint)value >> 0xc) | 0xe0,
               (byte)((uint)value >> 6) & 0x3f | 0x80,_1 & 0x3f | 0x80);
  }
  else {
    encoded_chars<char>::encoded_chars
              (&stack0xfffffffffffffff0,(byte)((uint)value >> 0x12) | 0xf0,
               (byte)((uint)value >> 0xc) & 0x3f | 0x80,(byte)((uint)value >> 6) & 0x3f | 0x80,
               _1 & 0x3f | 0x80);
  }
  return eStack_10;
}

Assistant:

encode(code_point value)
    {
        if (value <= 0x7F) {
            return {static_cast<char_type>(value)};
        }
        else if (value <= 0x7FF) {
            return {static_cast<char_type>((value >> 6) | 0xC0),
                    static_cast<char_type>((value & 0x3F) | 0x80)};
        }
        else if (TCB_LIKELY(value <= 0xFFFF)) {
            return {static_cast<char_type>((value >> 12) | 0xE0),
                    static_cast<char_type>(((value >> 6) & 0x3F) | 0x80),
                    static_cast<char_type>((value & 0x3F) | 0x80)};
        }
        else {
            return {static_cast<char_type>((value >> 18) | 0xF0),
                    static_cast<char_type>(((value >> 12) & 0x3F) | 0x80),
                    static_cast<char_type>(((value >> 6) & 0x3F) | 0x80),
                    static_cast<char_type>((value & 0x3F) | 0x80)};
        }
    }